

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::setEBDirichlet(MLEBABecLap *this,int amrlev,MultiFab *phi,Real beta)

{
  pointer piVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  BoxArray *__args_1;
  BoxArray *__args;
  pointer pFVar5;
  Geometry *this_00;
  FabArray<amrex::EBCellFlagFab> *fabarray_;
  MFItInfo *this_01;
  pointer this_02;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_amrex::EBCellFlag> *flag;
  Array4<const_double> *phiin;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType t;
  Array4<double> *betaout;
  Array4<double> *phiout;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int mglev_1;
  int ngrow;
  int mglev;
  bool phi_on_centroid;
  int ncomp;
  MFIter *in_stack_fffffffffffffa08;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffa10;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffa18;
  MFIter *in_stack_fffffffffffffa20;
  undefined1 cross;
  Periodicity *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  FabType in_stack_fffffffffffffa34;
  MFInfo *in_stack_fffffffffffffa38;
  int *in_stack_fffffffffffffa40;
  int *in_stack_fffffffffffffa48;
  DistributionMapping *in_stack_fffffffffffffa50;
  BoxArray *in_stack_fffffffffffffa58;
  BoxArray *in_stack_fffffffffffffa70;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  Periodicity local_4f8 [3];
  Box *in_stack_fffffffffffffb30;
  EBCellFlagFab *in_stack_fffffffffffffb38;
  undefined1 local_4b0 [216];
  RefID local_3d8;
  long local_3d0 [8];
  long *local_390;
  undefined1 local_384 [36];
  MFIter local_360;
  MFItInfo local_2fc;
  FabArray<amrex::EBCellFlagFab> *local_2e8;
  Geometry *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined4 local_2a4;
  int local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  uint local_258;
  undefined4 local_254;
  byte local_24d;
  int local_24c;
  undefined8 local_248;
  undefined8 local_228;
  int local_220;
  pointer local_218;
  int local_20c;
  int iStack_208;
  int local_204;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  int local_1f8;
  pointer local_1f0;
  int local_1e4;
  int iStack_1e0;
  int local_1dc;
  undefined8 local_1d8;
  int local_1d0;
  pointer local_1c8;
  int local_1bc;
  int iStack_1b8;
  int local_1b4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  int local_1a8;
  pointer local_1a0;
  int local_194;
  int iStack_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  Ref *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  long *local_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  Ref *local_148;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  long *local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  Ref *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  long *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  Periodicity *local_e8;
  uint *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  FabArray<amrex::EBCellFlagFab> *local_c8;
  undefined4 local_bc;
  undefined1 *local_b8;
  undefined4 local_ac;
  undefined1 *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  undefined1 *local_88;
  undefined4 local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  pointer local_58;
  undefined4 local_4c;
  pointer local_48;
  undefined4 local_3c;
  pointer local_38;
  undefined4 local_2c;
  pointer local_28;
  undefined4 local_1c;
  pointer local_18;
  undefined4 local_c;
  pointer local_8;
  
  local_248 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_24c = (**(code **)(*in_RDI + 0x28))();
  local_24d = *(int *)((long)in_RDI + 0x32c) == 3;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
  bVar3 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  if (bVar3) {
    local_254 = 0;
    local_258 = local_24d & 1;
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    in_stack_fffffffffffffa70 =
         Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                   ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                    in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    local_278 = 0;
    uStack_270 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_268 = 0;
    MFInfo::MFInfo((MFInfo *)0x177afd1);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    in_stack_fffffffffffffa08 =
         (MFIter *)
         std::
         unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)in_stack_fffffffffffffa10);
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa70);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffa10,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffa08);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffa10);
    MFInfo::~MFInfo((MFInfo *)0x177b091);
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
  bVar3 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  if (bVar3) {
    for (local_298 = 0; iVar2 = local_298,
        piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
                            (size_type)in_stack_fffffffffffffa08), iVar2 < *piVar4;
        local_298 = local_298 + 1) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      __args_1 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                           ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                            in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      __args = (BoxArray *)
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
               operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      local_2a4 = 0;
      local_2c8 = 0;
      uStack_2c0 = 0;
      local_2d8 = 0;
      uStack_2d0 = 0;
      local_2b8 = 0;
      MFInfo::MFInfo((MFInfo *)0x177b1cd);
      Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      in_stack_fffffffffffffa08 =
           (MFIter *)
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffffa10);
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                (__args,(DistributionMapping *)__args_1,in_stack_fffffffffffffa48,
                 in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa70);
      Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffffa10,
                 (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffffa08);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffffa10);
      MFInfo::~MFInfo((MFInfo *)0x177b29a);
    }
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
  pFVar5 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_fffffffffffffa10);
  if (pFVar5 == (pointer)0x0) {
    this_00 = (Geometry *)0x0;
  }
  else {
    this_00 = (Geometry *)
              __dynamic_cast(pFVar5,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
  }
  local_2e0 = this_00;
  if (this_00 == (Geometry *)0x0) {
    fabarray_ = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    fabarray_ = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffffa10);
  }
  local_2e8 = fabarray_;
  MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffffa20);
  this_01 = MFItInfo::EnableTiling(&local_2fc,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_01,true);
  MFIter::MFIter((MFIter *)this_00,&fabarray_->super_FabArrayBase,
                 (MFItInfo *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  while( true ) {
    bVar3 = MFIter::isValid(&local_360);
    cross = (undefined1)((ulong)in_stack_fffffffffffffa20 >> 0x38);
    if (!bVar3) break;
    MFIter::tilebox((MFIter *)in_stack_fffffffffffffa70);
    local_384._28_8_ = local_384;
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x177b438);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa18,
               (MFIter *)in_stack_fffffffffffffa10);
    local_390 = local_3d0;
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x177b490);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa18,
               (MFIter *)in_stack_fffffffffffffa10);
    local_3d8.data = (Ref *)(local_4b0 + 0x98);
    if (local_2e8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      in_stack_fffffffffffffa34 = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      in_stack_fffffffffffffa34 =
           EBCellFlagFab::getType(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    }
    local_4b0._148_4_ = in_stack_fffffffffffffa34;
    if ((in_stack_fffffffffffffa34 == regular) || (in_stack_fffffffffffffa34 == covered)) {
      local_1f0 = (pointer)local_384._28_8_;
      local_38 = (pointer)local_384._28_8_;
      local_3c = 0;
      local_1e4 = *(int *)local_384._28_8_;
      local_48 = (pointer)local_384._28_8_;
      local_4c = 1;
      iStack_1e0 = *(int *)(local_384._28_8_ + 4);
      local_4b0._120_8_ = *(undefined8 *)local_384._28_8_;
      local_58 = (pointer)local_384._28_8_;
      local_5c = 2;
      local_4b0._128_4_ = (undefined4)*(size_type *)(local_384._28_8_ + 8);
      local_1a0 = (pointer)local_384._28_8_;
      local_98 = (int *)((long)(local_384._28_8_ + 8) + 4);
      local_9c = 0;
      local_194 = *local_98;
      local_a8 = (undefined1 *)((long)(local_384._28_8_ + 8) + 4);
      local_ac = 1;
      iStack_190 = *(int *)(local_384._28_8_ + 0x10);
      local_4b0._88_8_ = *(undefined8 *)local_98;
      local_b8 = (undefined1 *)((long)(local_384._28_8_ + 8) + 4);
      local_bc = 2;
      local_4b0._96_4_ = *(int *)((long)(local_384._28_8_ + 0x10) + 4);
      for (local_4b0._84_4_ = 0; iVar2 = local_4b0._128_4_, local_4b0._108_8_ = local_4b0._88_8_,
          local_4b0._116_4_ = local_4b0._96_4_, local_4b0._136_8_ = local_4b0._120_8_,
          local_4b0._144_4_ = local_4b0._128_4_,
          local_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._120_8_,
          local_1f8 = local_4b0._128_4_, local_1dc = local_4b0._128_4_,
          local_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._88_8_,
          local_1a8 = local_4b0._96_4_, local_18c = local_4b0._96_4_,
          (int)local_4b0._84_4_ < local_24c; local_4b0._84_4_ = local_4b0._84_4_ + 1) {
        while (local_4b0._80_4_ = iVar2, iVar2 = iStack_1e0,
              (int)local_4b0._80_4_ <= (int)local_4b0._96_4_) {
          while (local_4b0._76_4_ = iVar2, iVar2 = local_1e4, (int)local_4b0._76_4_ <= iStack_190) {
            while (local_4b0._72_4_ = iVar2, (int)local_4b0._72_4_ <= local_194) {
              local_100 = local_390;
              local_104 = local_4b0._72_4_;
              local_108 = local_4b0._76_4_;
              local_10c = local_4b0._80_4_;
              local_110 = local_4b0._84_4_;
              *(undefined8 *)
               (*local_390 +
               ((long)(local_4b0._72_4_ - (int)local_390[4]) +
                (long)(local_4b0._76_4_ - *(int *)((long)local_390 + 0x24)) * local_390[1] +
                (long)(local_4b0._80_4_ - (int)local_390[5]) * local_390[2] +
               (long)(int)local_4b0._84_4_ * local_390[3]) * 8) = 0;
              local_118 = local_3d8.data;
              local_11c = local_4b0._72_4_;
              local_120 = local_4b0._76_4_;
              local_124 = local_4b0._80_4_;
              local_128 = local_4b0._84_4_;
              piVar1 = ((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start +
                       ((long)(local_4b0._72_4_ -
                              *(int *)&((local_3d8.data)->m_index_array).
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish) +
                        (long)(local_4b0._76_4_ -
                              *(int *)((long)&((local_3d8.data)->m_index_array).
                                              super_vector<int,_std::allocator<int>_>.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish + 4)) *
                        (long)((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish +
                        (long)(local_4b0._80_4_ -
                              *(int *)&((local_3d8.data)->m_index_array).
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage) *
                        (long)((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                       (long)(int)local_4b0._84_4_ *
                       (long)((local_3d8.data)->m_index_array).
                             super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) * 2;
              piVar1[0] = 0;
              piVar1[1] = 0;
              iVar2 = local_4b0._72_4_ + 1;
            }
            iVar2 = local_4b0._76_4_ + 1;
          }
          iVar2 = local_4b0._80_4_ + 1;
        }
      }
    }
    else {
      in_stack_fffffffffffffa18 = (FabArray<amrex::EBCellFlagFab> *)local_4b0;
      in_stack_fffffffffffffa20 = &local_360;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa18,
                 (MFIter *)in_stack_fffffffffffffa10);
      in_stack_fffffffffffffa28 = local_4f8;
      local_4b0._64_8_ = in_stack_fffffffffffffa18;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (in_stack_fffffffffffffa18,(MFIter *)in_stack_fffffffffffffa10);
      local_218 = (pointer)local_384._28_8_;
      local_8 = (pointer)local_384._28_8_;
      local_c = 0;
      local_20c = *(int *)local_384._28_8_;
      local_18 = (pointer)local_384._28_8_;
      local_1c = 1;
      iStack_208 = *(int *)(local_384._28_8_ + 4);
      local_228 = *(undefined8 *)local_384._28_8_;
      local_28 = (pointer)local_384._28_8_;
      local_2c = 2;
      local_220 = (int)*(size_type *)(local_384._28_8_ + 8);
      local_1c8 = (pointer)local_384._28_8_;
      local_68 = (int *)((long)(local_384._28_8_ + 8) + 4);
      local_6c = 0;
      local_1bc = *local_68;
      local_78 = (undefined1 *)((long)(local_384._28_8_ + 8) + 4);
      local_7c = 1;
      iStack_1b8 = *(int *)(local_384._28_8_ + 0x10);
      local_1d8 = *(undefined8 *)local_68;
      local_88 = (undefined1 *)((long)(local_384._28_8_ + 8) + 4);
      local_8c = 2;
      local_1d0 = *(int *)((long)(local_384._28_8_ + 0x10) + 4);
      for (local_53c = 0; local_540 = local_220, local_204 = local_220, local_1b4 = local_1d0,
          local_53c < local_24c; local_53c = local_53c + 1) {
        for (; local_544 = iStack_208, local_540 <= local_1d0; local_540 = local_540 + 1) {
          for (; local_548 = local_20c, local_544 <= iStack_1b8; local_544 = local_544 + 1) {
            for (; local_548 <= local_1bc; local_548 = local_548 + 1) {
              local_ec = local_548;
              local_f0 = local_544;
              local_f4 = local_540;
              local_e0 = (uint *)(*(long *)(in_stack_fffffffffffffa28->period).vect +
                                 ((long)(local_548 - in_stack_fffffffffffffa28[2].period.vect[2]) +
                                  (long)(local_544 - in_stack_fffffffffffffa28[3].period.vect[0]) *
                                  *(long *)((in_stack_fffffffffffffa28->period).vect + 2) +
                                 (long)(local_540 - in_stack_fffffffffffffa28[3].period.vect[1]) *
                                 *(long *)(in_stack_fffffffffffffa28[1].period.vect + 1)) * 4);
              if ((*local_e0 & 3) == 1) {
                local_c8 = (FabArray<amrex::EBCellFlagFab> *)local_4b0._64_8_;
                local_cc = local_548;
                local_d0 = local_544;
                local_d4 = local_540;
                local_d8 = local_53c;
                local_130 = local_390;
                local_134 = local_548;
                local_138 = local_544;
                local_13c = local_540;
                local_140 = local_53c;
                *(undefined8 *)
                 (*local_390 +
                 ((long)(local_548 - (int)local_390[4]) +
                  (long)(local_544 - *(int *)((long)local_390 + 0x24)) * local_390[1] +
                  (long)(local_540 - (int)local_390[5]) * local_390[2] +
                 (long)local_53c * local_390[3]) * 8) =
                     *(undefined8 *)
                      (*(long *)local_4b0._64_8_ +
                      ((long)(local_548 - *(int *)(local_4b0._64_8_ + 0x20)) +
                       (long)(local_544 - *(int *)(local_4b0._64_8_ + 0x24)) *
                       *(long *)&((BoxArray *)(local_4b0._64_8_ + 8))->m_bat +
                       (long)(local_540 - *(int *)(local_4b0._64_8_ + 0x28)) *
                       *(long *)(local_4b0._64_8_ + 0x10) +
                      (long)local_53c * *(long *)(local_4b0._64_8_ + 0x18)) * 8);
                local_148 = local_3d8.data;
                local_14c = local_548;
                local_150 = local_544;
                local_154 = local_540;
                local_158 = local_53c;
                *(undefined8 *)
                 (((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start +
                 ((long)(local_548 -
                        *(int *)&((local_3d8.data)->m_index_array).
                                 super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish) +
                  (long)(local_544 -
                        *(int *)((long)&((local_3d8.data)->m_index_array).
                                        super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 4)) *
                  (long)((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                  (long)(local_540 -
                        *(int *)&((local_3d8.data)->m_index_array).
                                 super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage) *
                  (long)((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage +
                 (long)local_53c *
                 (long)((local_3d8.data)->m_index_array).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start) * 2) = local_248;
              }
              else {
                local_160 = local_390;
                local_164 = local_548;
                local_168 = local_544;
                local_16c = local_540;
                local_170 = local_53c;
                *(undefined8 *)
                 (*local_390 +
                 ((long)(local_548 - (int)local_390[4]) +
                  (long)(local_544 - *(int *)((long)local_390 + 0x24)) * local_390[1] +
                  (long)(local_540 - (int)local_390[5]) * local_390[2] +
                 (long)local_53c * local_390[3]) * 8) = 0;
                local_178 = local_3d8.data;
                local_17c = local_548;
                local_180 = local_544;
                local_184 = local_540;
                local_188 = local_53c;
                piVar1 = ((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start +
                         ((long)(local_548 -
                                *(int *)&((local_3d8.data)->m_index_array).
                                         super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish) +
                          (long)(local_544 -
                                *(int *)((long)&((local_3d8.data)->m_index_array).
                                                super_vector<int,_std::allocator<int>_>.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish + 4)) *
                          (long)((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish +
                          (long)(local_540 -
                                *(int *)&((local_3d8.data)->m_index_array).
                                         super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage) *
                          (long)((local_3d8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage +
                         (long)local_53c *
                         (long)((local_3d8.data)->m_index_array).
                               super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) * 2;
                piVar1[0] = 0;
                piVar1[1] = 0;
              }
              local_e8 = in_stack_fffffffffffffa28;
            }
          }
        }
      }
    }
    MFIter::operator++(&local_360);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffa10);
  if ((local_24d & 1) != 0) {
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
    this_02 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                        ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                         0x177c0e3);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)this_02,(size_type)in_stack_fffffffffffffa08);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)this_02,
               (size_type)in_stack_fffffffffffffa08);
    Geometry::periodicity(this_00);
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28,(bool)cross);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, Real beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    phiout(i,j,k,n) = phiin(i,j,k,n);
                    betaout(i,j,k,n) = beta;
                } else {
                    phiout(i,j,k,n) = 0.0;
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}